

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t extraout_RAX;
  value_type *pvVar2;
  ssize_t sVar3;
  void *__buf_00;
  undefined4 in_register_00000034;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  TypeSig *local_18;
  TypeSig *signature_local;
  writer *this_local;
  
  local_18 = (TypeSig *)CONCAT44(in_register_00000034,__fd);
  signature_local = (TypeSig *)this;
  if (((this->abi_types & 1U) == 0) && (bVar1 = winmd::reader::TypeSig::is_szarray(local_18), bVar1)
     ) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"com_array<%>");
    pvVar2 = winmd::reader::TypeSig::Type(local_18);
    writer_base<cppwinrt::writer>::
    write<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
              (&this->super_writer_base<cppwinrt::writer>,&local_28,pvVar2);
    sVar3 = extraout_RAX;
  }
  else {
    pvVar2 = winmd::reader::TypeSig::Type(local_18);
    sVar3 = write(this,(int)pvVar2,__buf_00,__n);
  }
  return sVar3;
}

Assistant:

void write(TypeSig const& signature)
        {
            if (!abi_types && signature.is_szarray())
            {
                write("com_array<%>", signature.Type());
            }
            else
            {
                write(signature.Type());
            }
        }